

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O2

void __thiscall
LinkedReadsDatastore::LinkedReadsDatastore
          (LinkedReadsDatastore *this,WorkSpace *ws,string *read1_filename,string *read2_filename,
          string *output_filename,LinkedReadsFormat format,string *default_name,int readsize)

{
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  LinkedReadsMapper::LinkedReadsMapper(&this->mapper,ws,this);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->default_name)._M_dataplus._M_p = (pointer)&(this->default_name).field_2;
  (this->default_name)._M_string_length = 0;
  (this->default_name).field_2._M_local_buf[0] = '\0';
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->fd = (FILE *)0x0;
  this->ws = ws;
  std::__cxx11::string::string((string *)&local_50,(string *)output_filename);
  std::__cxx11::string::string((string *)&local_70,(string *)default_name);
  std::__cxx11::string::string((string *)&local_90,(string *)read1_filename);
  std::__cxx11::string::string((string *)&local_b0,(string *)read2_filename);
  build_from_fastq(&local_50,&local_70,&local_90,&local_b0,format,(long)readsize,0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

LinkedReadsDatastore::LinkedReadsDatastore(WorkSpace &ws, std::string read1_filename, std::string read2_filename,
                                           std::string output_filename, LinkedReadsFormat format,
                                           std::string default_name, int readsize) : ws(ws), mapper(ws, *this) {
    build_from_fastq(output_filename, default_name, read1_filename, read2_filename, format, readsize, 0);
}